

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraSublimeTextGenerator::ComputeFlagsForObject_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *gtgt)

{
  cmMakefile *this_00;
  string *psVar1;
  cmValue cVar2;
  string language;
  string COMPILE_OPTIONS;
  string COMPILE_FLAGS;
  cmGeneratorExpressionInterpreter genexInterpreter;
  allocator<char> local_189;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  cmGeneratorExpressionInterpreter local_a8;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar1 = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(source);
  std::__cxx11::string::string((string *)&local_188,(string *)psVar1);
  if (local_188._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&local_188);
  }
  cmGeneratorTarget::AddExplicitLanguageFlags(gtgt,__return_storage_ptr__,source);
  this_00 = lg->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_148);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  cmLocalGenerator::GetTargetCompileFlags
            (&local_40,lg,gtgt,psVar1,&local_188,__return_storage_ptr__);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_40);
  std::__cxx11::string::string((string *)&local_c8,(string *)psVar1);
  std::__cxx11::string::string((string *)&local_e8,(string *)&local_188);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&local_a8,lg,&local_c8,gtgt,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"COMPILE_FLAGS",(allocator<char> *)&local_168);
  cVar2 = cmSourceFile::GetProperty(source,&local_148);
  if (cVar2.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_108,(string *)cVar2.Value);
    psVar1 = cmGeneratorExpressionInterpreter::Evaluate(&local_a8,&local_108,&local_148);
    (*lg->_vptr_cmLocalGenerator[6])(lg,__return_storage_ptr__,psVar1);
    std::__cxx11::string::~string((string *)&local_108);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"COMPILE_OPTIONS",&local_189);
  cVar2 = cmSourceFile::GetProperty(source,&local_168);
  if (cVar2.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_128,(string *)cVar2.Value);
    psVar1 = cmGeneratorExpressionInterpreter::Evaluate(&local_a8,&local_128,&local_168);
    cmLocalGenerator::AppendCompileOptions(lg,__return_storage_ptr__,psVar1,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_128);
  }
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter(&local_a8);
  std::__cxx11::string::~string((string *)&local_188);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeFlagsForObject(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* gtgt)
{
  std::string flags;
  std::string language = source->GetOrDetermineLanguage();
  if (language.empty()) {
    language = "C";
  }

  // Explicitly add the explicit language flag before any other flag
  // so user flags can override it.
  gtgt->AddExplicitLanguageFlags(flags, *source);

  std::string const& config =
    lg->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");

  lg->GetTargetCompileFlags(gtgt, config, language, flags);

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(lg, config, gtgt,
                                                    language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (cmValue cflags = source->GetProperty(COMPILE_FLAGS)) {
    lg->AppendFlags(flags, genexInterpreter.Evaluate(*cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (cmValue coptions = source->GetProperty(COMPILE_OPTIONS)) {
    lg->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(*coptions, COMPILE_OPTIONS));
  }

  return flags;
}